

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O1

void __thiscall
Indexing::SubstitutionTree<Indexing::TermWithoutValue>::FastGeneralizationsIterator::
FastGeneralizationsIterator<Kernel::TypedTermList>
          (FastGeneralizationsIterator *this,SubstitutionTree<Indexing::TermWithoutValue> *parent,
          Node *root,TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  SubstitutionTree<Indexing::TermWithoutValue>::GenMatcher::GenMatcher<Kernel::TypedTermList>
            (&this->_subst,query,parent->_nextVar);
  (this->_ldIterator)._core = (IteratorCore<Indexing::TermWithoutValue_*> *)0x0;
  (this->_resultNormalizer)._data._timestamp = 1;
  (this->_resultNormalizer)._data._size = 0;
  (this->_resultNormalizer)._data._deleted = 0;
  (this->_resultNormalizer)._data._capacityIndex = 0;
  (this->_resultNormalizer)._data._capacity = 0;
  *(undefined8 *)&(this->_resultNormalizer)._data._nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&(this->_resultNormalizer)._data._entries + 4) = 0;
  *(undefined8 *)((long)&(this->_resultNormalizer)._data._afterLast + 4) = 0;
  (this->_resultNormalizer)._identity = true;
  (this->_alternatives)._capacity = 0;
  (this->_alternatives)._stack = (void **)0x0;
  (this->_alternatives)._cursor = (void **)0x0;
  (this->_alternatives)._end = (void **)0x0;
  (this->_specVarNumbers)._capacity = 0;
  (this->_specVarNumbers)._stack = (uint *)0x0;
  (this->_specVarNumbers)._cursor = (uint *)0x0;
  (this->_specVarNumbers)._end = (uint *)0x0;
  (this->_nodeTypes)._capacity = 0;
  (this->_nodeTypes)._stack = (NodeAlgorithm *)0x0;
  (this->_nodeTypes)._cursor = (NodeAlgorithm *)0x0;
  (this->_nodeTypes)._end = (NodeAlgorithm *)0x0;
  init<Kernel::TypedTermList>(this,parent,root,query,retrieveSubstitution,reversed);
  return;
}

Assistant:

FastGeneralizationsIterator(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed)
      : _subst(query, parent->_nextVar)
      { init(parent, root, query, retrieveSubstitution, reversed); }